

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O3

void __thiscall
Js::ByteCodeWriter::ArgOut<false>
          (ByteCodeWriter *this,ArgSlot arg,RegSlot reg,ProfileId callSiteId,bool emitProfiledArgout
          )

{
  code *pcVar1;
  bool bVar2;
  RegSlot reg_00;
  undefined4 *puVar3;
  FunctionBody *this_00;
  ArgSlot local_2e;
  RegSlot local_2c;
  
  CheckOpen(this);
  bVar2 = OpCodeAttr::HasMultiSizeLayout(ArgOut_A);
  if (bVar2) {
    bVar2 = OpCodeAttr::HasMultiSizeLayout(ArgOut_ANonVar);
    if (!bVar2) goto LAB_0089b8eb;
  }
  else {
LAB_0089b8eb:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x2c3,
                                "(OpCodeAttr::HasMultiSizeLayout(OpCode::ArgOut_A) && OpCodeAttr::HasMultiSizeLayout(OpCode::ArgOut_ANonVar))"
                                ,
                                "OpCodeAttr::HasMultiSizeLayout(OpCode::ArgOut_A) && OpCodeAttr::HasMultiSizeLayout(OpCode::ArgOut_ANonVar)"
                               );
    if (!bVar2) goto LAB_0089ba7e;
    *puVar3 = 0;
  }
  if (reg != 0xffffffff) {
    this_00 = this->m_functionWrite;
    if (this_00 == (FunctionBody *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                  ,0x12a,"(this->m_functionWrite)","this->m_functionWrite");
      if (!bVar2) goto LAB_0089ba7e;
      *puVar3 = 0;
      this_00 = this->m_functionWrite;
    }
    reg_00 = FunctionBody::MapRegSlot(this_00,reg);
    bVar2 = TryWriteArg<Js::LayoutSizePolicy<(Js::LayoutSize)0>>(this,ArgOut_ANonVar,arg,reg_00);
    if (!bVar2) {
      bVar2 = TryWriteArg<Js::LayoutSizePolicy<(Js::LayoutSize)1>>(this,ArgOut_ANonVar,arg,reg_00);
      if (!bVar2) {
        local_2e = arg;
        local_2c = reg_00;
        Data::EncodeT<(Js::LayoutSize)2>(&this->m_byteCodeData,ArgOut_ANonVar,this);
        Data::Write(&this->m_byteCodeData,&local_2e,6);
      }
    }
    return;
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  *puVar3 = 1;
  bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                              ,0x146,"(registerID != Js::Constants::NoRegister)","bad register");
  if (bVar2) {
    *puVar3 = 0;
    Throw::InternalError();
  }
LAB_0089ba7e:
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

void ByteCodeWriter::ArgOut(ArgSlot arg, RegSlot reg, ProfileId callSiteId, bool emitProfiledArgout)
    {
        CheckOpen();
        Assert(OpCodeAttr::HasMultiSizeLayout(OpCode::ArgOut_A) && OpCodeAttr::HasMultiSizeLayout(OpCode::ArgOut_ANonVar));

        // Note: don't "consume" the arg slot, as the passed-in value is the final one.
        reg = ConsumeReg(reg);

        OpCode op;
        if (isVar)
        {
            op = OpCode::ArgOut_A;
        }
        else
        {
            op = OpCode::ArgOut_ANonVar;
            MULTISIZE_LAYOUT_WRITE(Arg, op, arg, reg);
            return;
        }

        if (emitProfiledArgout
            && DoDynamicProfileOpcode(InlinePhase)
            && arg > 0 && arg < Js::Constants::MaximumArgumentCountForConstantArgumentInlining
            && reg > FunctionBody::FirstRegSlot
            && callSiteId != Js::Constants::NoProfileId
            )
        {
            MULTISIZE_LAYOUT_WRITE(Arg, Js::OpCode::ProfiledArgOut_A, arg, reg);
            m_byteCodeData.Encode(&callSiteId, sizeof(Js::ProfileId));
        }
        else
        {
            MULTISIZE_LAYOUT_WRITE(Arg, op, arg, reg);
            return;
        }
    }